

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O3

bool __thiscall ON_ClippingPlane::Read(ON_ClippingPlane *this,ON_BinaryArchive *file)

{
  ON_UuidList *this_00;
  ON_ClippingPlaneDataStore *dataStore;
  bool *b;
  ON_UUID uuid;
  bool bVar1;
  bool bVar2;
  ON_ClippingPlaneData *pOVar3;
  long lVar4;
  int iVar5;
  ON_Plane *pOVar6;
  ON__INT32 *p;
  ON_UUID *pOVar7;
  ON_ClippingPlane *pOVar8;
  double depth;
  uchar itemid;
  int minor_version;
  int count;
  double d;
  int major_version;
  ON_UUID viewport_id;
  byte local_71;
  int local_70;
  ON__INT32 local_6c;
  ON_UUID local_68;
  ON_UuidList *local_50;
  int local_44;
  ON_UUID local_40;
  
  pOVar6 = &ON_xy_plane;
  pOVar8 = this;
  for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
    (pOVar8->m_plane).origin.x = (pOVar6->origin).x;
    pOVar6 = (ON_Plane *)&(pOVar6->origin).y;
    pOVar8 = (ON_ClippingPlane *)&(pOVar8->m_plane).origin.y;
  }
  this_00 = &this->m_viewport_ids;
  ON_UuidList::Empty(this_00);
  (this->m_plane_id).Data1 = 0;
  (this->m_plane_id).Data2 = 0;
  (this->m_plane_id).Data3 = 0;
  (this->m_plane_id).Data4[0] = '\0';
  (this->m_plane_id).Data4[1] = '\0';
  (this->m_plane_id).Data4[2] = '\0';
  (this->m_plane_id).Data4[3] = '\0';
  (this->m_plane_id).Data4[4] = '\0';
  (this->m_plane_id).Data4[5] = '\0';
  (this->m_plane_id).Data4[6] = '\0';
  (this->m_plane_id).Data4[7] = '\0';
  this->m_bEnabled = true;
  this->m_depth_enabled = false;
  this->m_participation_lists_enabled = false;
  dataStore = &this->m_data_store;
  DeleteClippingPlaneData(dataStore);
  local_44 = 0;
  local_70 = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk(file,0x40008000,&local_44,&local_70);
  if (!bVar1) {
    return false;
  }
  if ((local_44 == 1) && (bVar1 = ON_BinaryArchive::ReadUuid(file,&local_40), bVar1)) {
    if (local_70 == 0) {
      ON_UuidList::AddUuid(this_00,local_40,true);
    }
    bVar1 = ON_BinaryArchive::ReadUuid(file,&this->m_plane_id);
    if (((bVar1) && (bVar1 = ON_BinaryArchive::ReadPlane(file,&this->m_plane), bVar1)) &&
       (bVar1 = ON_BinaryArchive::ReadBool(file,&this->m_bEnabled), bVar1)) {
      bVar1 = true;
      if (local_70 < 1) goto LAB_0056ce51;
      bVar2 = ON_UuidList::Read(this_00,file);
      if (bVar2) {
        if (local_70 < 2) goto LAB_0056ce51;
        local_68.Data1 = 0;
        local_68.Data2 = 0;
        local_68.Data3 = 0xbff0;
        bVar2 = ON_BinaryArchive::ReadDouble(file,(double *)&local_68);
        if (bVar2) {
          b = &this->m_depth_enabled;
          depth = (double)CONCAT44(local_68._4_4_,local_68.Data1);
          if (local_70 < 4) {
            if ((depth < 0.0) || ((depth == 1.2343210235867887e+38 && (!NAN(depth))))) {
              *b = false;
              local_68.Data1 = 0;
              local_68.Data2 = 0;
              local_68.Data3 = 0;
              depth = 0.0;
            }
            else {
              *b = true;
            }
          }
          SetDepth(this,depth);
          if (local_70 < 4) goto LAB_0056ce51;
          bVar2 = ON_BinaryArchive::ReadBool(file,b);
          if (bVar2) {
            if (local_70 < 5) goto LAB_0056ce51;
            local_71 = 0xff;
            bVar1 = ON_BinaryArchive::ReadChar(file,&local_71);
            if (bVar1) {
              bVar2 = true;
              bVar1 = bVar2;
              if (local_71 == 0) goto LAB_0056ce51;
              if (local_71 == 10) {
                p = &local_6c;
                local_6c = 0;
                bVar1 = ON_BinaryArchive::ReadInt(file,p);
                if (!bVar1) goto LAB_0056ce4e;
                pOVar3 = GetClippingPlaneData(dataStore,SUB81(p,0));
                local_68.Data1 = 0;
                local_68.Data2 = 0;
                local_68.Data3 = 0;
                local_68.Data4[0] = '\0';
                local_68.Data4[1] = '\0';
                local_68.Data4[2] = '\0';
                local_68.Data4[3] = '\0';
                local_68.Data4[4] = '\0';
                local_68.Data4[5] = '\0';
                local_68.Data4[6] = '\0';
                local_68.Data4[7] = '\0';
                if (0 < local_6c) {
                  local_50 = &pOVar3->m_object_id_list;
                  iVar5 = 0;
                  do {
                    bVar1 = ON_BinaryArchive::Read3dmReferencedComponentId
                                      (file,ModelGeometry,&local_68);
                    if (!bVar1) goto LAB_0056ce4e;
                    if (pOVar3 != (ON_ClippingPlaneData *)0x0) {
                      uuid.Data2 = local_68.Data2;
                      uuid.Data3 = local_68.Data3;
                      uuid.Data1 = local_68.Data1;
                      uuid.Data4[0] = local_68.Data4[0];
                      uuid.Data4[1] = local_68.Data4[1];
                      uuid.Data4[2] = local_68.Data4[2];
                      uuid.Data4[3] = local_68.Data4[3];
                      uuid.Data4[4] = local_68.Data4[4];
                      uuid.Data4[5] = local_68.Data4[5];
                      uuid.Data4[6] = local_68.Data4[6];
                      uuid.Data4[7] = local_68.Data4[7];
                      ON_UuidList::AddUuid(local_50,uuid,true);
                    }
                    iVar5 = iVar5 + 1;
                  } while (iVar5 < local_6c);
                }
                bVar1 = ON_BinaryArchive::ReadChar(file,&local_71);
                if (local_71 == 0 || !bVar1) goto LAB_0056ce51;
              }
              if (local_71 == 0xb) {
                pOVar7 = &local_68;
                local_68.Data1 = 0;
                bVar1 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)pOVar7);
                if (!bVar1) goto LAB_0056ce4e;
                pOVar3 = GetClippingPlaneData(dataStore,SUB81(pOVar7,0));
                if (0 < (int)local_68.Data1) {
                  local_50 = (ON_UuidList *)&pOVar3->m_layer_list;
                  iVar5 = 0;
                  do {
                    local_6c = 0;
                    bVar1 = ON_BinaryArchive::Read3dmReferencedComponentIndex(file,Layer,&local_6c);
                    if (!bVar1) goto LAB_0056ce4e;
                    if (pOVar3 != (ON_ClippingPlaneData *)0x0) {
                      ON_SimpleArray<int>::Append((ON_SimpleArray<int> *)local_50,&local_6c);
                      pOVar3->m_layer_list_is_sorted = false;
                    }
                    iVar5 = iVar5 + 1;
                  } while (iVar5 < (int)local_68.Data1);
                }
                bVar1 = ON_BinaryArchive::ReadChar(file,&local_71);
                if (local_71 == 0 || !bVar1) goto LAB_0056ce51;
              }
              if (local_71 == 0xc) {
                pOVar7 = &local_68;
                local_68.Data1 = CONCAT31(local_68.Data1._1_3_,1);
                bVar1 = ON_BinaryArchive::ReadBool(file,(bool *)pOVar7);
                if (!bVar1) goto LAB_0056ce4e;
                pOVar3 = GetClippingPlaneData(dataStore,SUB81(pOVar7,0));
                if (pOVar3 != (ON_ClippingPlaneData *)0x0) {
                  pOVar3->m_is_exclusion_list = local_68.Data1._0_1_;
                }
                bVar1 = ON_BinaryArchive::ReadChar(file,&local_71);
                if (local_71 == 0 || !bVar1) goto LAB_0056ce51;
              }
              if (local_71 == 0xd) {
                bVar1 = ON_BinaryArchive::ReadBool(file,&this->m_participation_lists_enabled);
                if (!bVar1) goto LAB_0056ce4e;
                bVar1 = ON_BinaryArchive::ReadChar(file,&local_71);
                if (local_71 == 0 || !bVar1) goto LAB_0056ce51;
              }
              bVar1 = bVar2;
              if (0xd < local_71) {
                local_71 = 0;
              }
              goto LAB_0056ce51;
            }
          }
        }
      }
    }
  }
LAB_0056ce4e:
  bVar1 = false;
LAB_0056ce51:
  bVar2 = ON_BinaryArchive::EndRead3dmChunk(file);
  return (bool)(bVar2 & bVar1);
}

Assistant:

bool ON_ClippingPlane::Read( ON_BinaryArchive& file )
{
  Default();

  int major_version = 0;
  int minor_version = 0;
  
  bool rc = file.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&major_version,&minor_version);
  if (!rc)
    return false;

  for(;;)
  {
    rc = (1 == major_version);
    if (!rc) break;

    ON_UUID viewport_id;
    rc = file.ReadUuid(viewport_id);
    if(!rc) break;

    if( 0 == minor_version )
      m_viewport_ids.AddUuid( viewport_id );

    rc = file.ReadUuid(m_plane_id);
    if (!rc) break;

    rc = file.ReadPlane(m_plane);
    if (!rc) break;

    rc = file.ReadBool(&m_bEnabled);
    if (!rc) break;

    if( minor_version > 0 )
    {
      rc = m_viewport_ids.Read(file);
      if (!rc) break;
    }

    if (minor_version > 1)
    {
      double d = -1;
      rc = file.ReadDouble(&d);
      if (!rc) break;

      if (minor_version < 4)
      {
        if (d >= 0.0 && d != ON_UNSET_POSITIVE_FLOAT)
        {
          m_depth_enabled = true;
        }
        else
        {
          m_depth_enabled = false;
          d = 0.0;
        }
      }

      SetDepth(d);
    }

    if (minor_version >= 4)
    {
      rc = file.ReadBool(&m_depth_enabled);
      if (!rc) break;
    }

    if (minor_version >= 5)
    {
      unsigned char itemid = 0xFF;
      rc = file.ReadChar(&itemid);
      if (!rc) break;
      if (0 == itemid)
        break;

      if (ON_ClippingPlaneTypeCodes::ClipParticipationObjectList == itemid) // 10
      {
        int count = 0;
        rc = file.ReadInt(&count);
        if (!rc) break;

        ON_ClippingPlaneData* data = GetClippingPlaneData(m_data_store, true);
        ON_UUID object_id = ON_nil_uuid;
        for (int i = 0; i < count; i++)
        {
          rc = file.Read3dmReferencedComponentId(ON_ModelComponent::Type::ModelGeometry, &object_id);
          if (!rc) break;
          if (data)
            data->m_object_id_list.AddUuid(object_id);
        }
        if (!rc) break;

        rc = file.ReadChar(&itemid);
        if (!rc || 0 == itemid) break;
      }
      if (ON_ClippingPlaneTypeCodes::ClipParticipationLayerList == itemid) // 11
      {
        int count = 0;
        rc = file.ReadInt(&count);
        if (!rc) break;

        ON_ClippingPlaneData* data = GetClippingPlaneData(m_data_store, true);
        for (int i = 0; i < count; i++)
        {
          int layer_index = 0;
          rc = file.Read3dmReferencedComponentIndex(ON_ModelComponent::Type::Layer, &layer_index);
          if (!rc) break;

          if (data)
          {
            data->m_layer_list.Append(layer_index);
            data->m_layer_list_is_sorted = false;
          }
        }
        if (!rc) break;

        rc = file.ReadChar(&itemid);
        if (!rc || 0 == itemid) break;
      }
      if (ON_ClippingPlaneTypeCodes::ClipParticipationIsExclusion == itemid) // 12
      {
        bool exclusion = true;
        rc = file.ReadBool(&exclusion);
        if (!rc) break;
        ON_ClippingPlaneData* data = GetClippingPlaneData(m_data_store, true);
        if (data)
          data->m_is_exclusion_list = exclusion;
        rc = file.ReadChar(&itemid);
        if (!rc || 0 == itemid) break;
      }
      if (ON_ClippingPlaneTypeCodes::ClipParticipationEnabled == itemid) // 13
      {
        rc = file.ReadBool(&m_participation_lists_enabled);
        if (!rc) break;
        rc = file.ReadChar(&itemid);
        if (!rc || 0 == itemid) break;
      }

      if (itemid >= ON_ClippingPlaneTypeCodes::NextTypeCode)
      {
        // we are reading file written with code newer
        // than this code (minor_version > 5)
        itemid = 0;
      }

      break;
    }

    break;
  }

  if ( !file.EndRead3dmChunk() )
    rc = false;

  return rc;
}